

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this,
          vector<float,_pstd::pmr::polymorphic_allocator<float>_> *other,
          polymorphic_allocator<float> *alloc)

{
  float *pfVar1;
  size_t sVar2;
  float *pfVar3;
  size_t sVar4;
  
  (this->alloc).memoryResource = alloc->memoryResource;
  this->ptr = (float *)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  reserve(this,other->nStored);
  pfVar1 = other->ptr;
  sVar2 = other->nStored;
  pfVar3 = this->ptr;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    pfVar3[sVar4] = pfVar1[sVar4];
  }
  this->nStored = sVar2;
  return;
}

Assistant:

vector(const vector &other, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(other.size());
        for (size_t i = 0; i < other.size(); ++i)
            this->alloc.template construct<T>(ptr + i, other[i]);
        nStored = other.size();
    }